

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

size_t __thiscall
MemoryLeakDetectorTable::getTotalLeaks(MemoryLeakDetectorTable *this,MemLeakPeriod period)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  
  sVar3 = 0;
  for (lVar2 = 0; lVar2 != 0x248; lVar2 = lVar2 + 8) {
    sVar1 = MemoryLeakDetectorList::getTotalLeaks
                      ((MemoryLeakDetectorList *)((long)&this->table_[0].head_ + lVar2),period);
    sVar3 = sVar3 + sVar1;
  }
  return sVar3;
}

Assistant:

size_t MemoryLeakDetectorTable::getTotalLeaks(MemLeakPeriod period)
{
    size_t total_leaks = 0;
    for (int i = 0; i < hash_prime; i++)
        total_leaks += table_[i].getTotalLeaks(period);
    return total_leaks;
}